

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

string * __thiscall
cmsys::SystemInformationImplementation::ParseValueFromKStat_abi_cxx11_
          (string *__return_storage_ptr__,SystemInformationImplementation *this,char *arguments)

{
  bool bVar1;
  ulong uVar2;
  reference pvVar3;
  size_type sVar4;
  char *pcVar5;
  long local_1a8;
  size_t i_1;
  vector<const_char_*,_std::allocator<const_char_*>_> local_198;
  undefined1 local_180 [8];
  string buffer;
  value_type local_158;
  ulong local_150;
  size_t i;
  char *local_140;
  undefined1 local_138 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> args;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  undefined8 local_f0;
  char local_e1;
  char *local_e0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  undefined8 local_c8;
  reference local_c0;
  string *arg;
  ulong local_98;
  size_t b1;
  size_t b0;
  ulong uStack_80;
  bool inQuotes;
  size_t pos;
  size_t start;
  allocator<char> local_59;
  string local_58 [8];
  string command;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args_string;
  char *arguments_local;
  SystemInformationImplementation *this_local;
  string *value;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&command.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,arguments,&local_59);
  std::allocator<char>::~allocator(&local_59);
  pos = 0xffffffffffffffff;
  uStack_80 = std::__cxx11::string::find((char)local_58,0x20);
  do {
    if (uStack_80 == 0xffffffffffffffff) {
      std::__cxx11::string::size();
      std::__cxx11::string::substr
                ((ulong)&args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_58);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&command.field_2 + 8),
                  (value_type *)
                  &args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string
                ((string *)
                 &args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_138);
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&command.field_2 + 8));
      std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_138,sVar4 + 3);
      local_140 = "kstat";
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_138,&local_140);
      i = (size_t)anon_var_dwarf_c1b627;
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_138,(value_type *)&i);
      for (local_150 = 0; uVar2 = local_150,
          sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)((long)&command.field_2 + 8)), uVar2 < sVar4; local_150 = local_150 + 1)
      {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&command.field_2 + 8),local_150);
        local_158 = (value_type)std::__cxx11::string::c_str();
        std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                  ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_138,&local_158);
      }
      buffer.field_2._8_8_ = 0;
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_138,
                 (value_type *)((long)&buffer.field_2 + 8));
      std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                (&local_198,(vector<const_char_*,_std::allocator<const_char_*>_> *)local_138);
      RunProcess_abi_cxx11_((string *)local_180,this,&local_198);
      std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector(&local_198);
      std::__cxx11::string::string((string *)__return_storage_ptr__);
      local_1a8 = std::__cxx11::string::size();
      while (((local_1a8 = local_1a8 + -1, local_1a8 != 0 &&
              (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_180), *pcVar5 != ' '))
             && (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_180),
                *pcVar5 != '\t'))) {
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_180);
        if ((*pcVar5 != '\n') &&
           (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_180), *pcVar5 != '\r')) {
          std::__cxx11::string::operator[]((ulong)local_180);
          std::__cxx11::string::insert((ulong)__return_storage_ptr__,0,'\x01');
        }
      }
      std::__cxx11::string::~string((string *)local_180);
      std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_138);
      std::__cxx11::string::~string(local_58);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&command.field_2 + 8));
      return __return_storage_ptr__;
    }
    b0._7_1_ = 0;
    b1 = std::__cxx11::string::find((char)local_58,0x22);
    local_98 = std::__cxx11::string::find((char)local_58,0x22);
    while( true ) {
      bVar1 = false;
      if ((b1 != 0xffffffffffffffff) && (bVar1 = false, local_98 != 0xffffffffffffffff)) {
        bVar1 = b1 < local_98;
      }
      if (!bVar1) goto LAB_00658d45;
      if ((b1 < uStack_80) && (uStack_80 < local_98)) break;
      b1 = std::__cxx11::string::find((char)local_58,0x22);
      local_98 = std::__cxx11::string::find((char)local_58,0x22);
    }
    b0._7_1_ = 1;
LAB_00658d45:
    if ((b0._7_1_ & 1) == 0) {
      std::__cxx11::string::substr((ulong)&arg,(ulong)local_58);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&command.field_2 + 8),(value_type *)&arg);
      std::__cxx11::string::~string((string *)&arg);
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&command.field_2 + 8));
      local_c0 = pvVar3;
      local_d8._M_current = (char *)std::__cxx11::string::begin();
      local_e0 = (char *)std::__cxx11::string::end();
      local_e1 = '\"';
      local_d0 = std::remove<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                           (local_d8,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      )local_e0,&local_e1);
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_c8,&local_d0);
      local_f8._M_current = (char *)std::__cxx11::string::end();
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_f0,&local_f8);
      std::__cxx11::string::erase(pvVar3,local_c8,local_f0);
      pos = uStack_80;
    }
    uStack_80 = std::__cxx11::string::find((char)local_58,0x20);
  } while( true );
}

Assistant:

std::string SystemInformationImplementation::ParseValueFromKStat(
  const char* arguments)
{
  std::vector<std::string> args_string;
  std::string command = arguments;
  size_t start = std::string::npos;
  size_t pos = command.find(' ', 0);
  while (pos != std::string::npos) {
    bool inQuotes = false;
    // Check if we are between quotes
    size_t b0 = command.find('"', 0);
    size_t b1 = command.find('"', b0 + 1);
    while (b0 != std::string::npos && b1 != std::string::npos && b1 > b0) {
      if (pos > b0 && pos < b1) {
        inQuotes = true;
        break;
      }
      b0 = command.find('"', b1 + 1);
      b1 = command.find('"', b0 + 1);
    }

    if (!inQuotes) {
      args_string.push_back(command.substr(start + 1, pos - start - 1));
      std::string& arg = args_string.back();

      // Remove the quotes if any
      arg.erase(std::remove(arg.begin(), arg.end(), '"'), arg.end());
      start = pos;
    }
    pos = command.find(' ', pos + 1);
  }
  args_string.push_back(command.substr(start + 1, command.size() - start - 1));

  std::vector<const char*> args;
  args.reserve(3 + args_string.size());
  args.push_back("kstat");
  args.push_back("-p");
  for (size_t i = 0; i < args_string.size(); ++i) {
    args.push_back(args_string[i].c_str());
  }
  args.push_back(KWSYS_NULLPTR);

  std::string buffer = this->RunProcess(args);

  std::string value;
  for (size_t i = buffer.size() - 1; i > 0; i--) {
    if (buffer[i] == ' ' || buffer[i] == '\t') {
      break;
    }
    if (buffer[i] != '\n' && buffer[i] != '\r') {
      value.insert(0u, 1, buffer[i]);
    }
  }
  return value;
}